

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O0

void __thiscall
Disa::Adjacency_Graph<false>::insert_vertex_adjacent_list
          (Adjacency_Graph<false> *this,size_t vertex,size_t insert_vertex)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88;
  const_iterator local_80;
  unsigned_long *local_78;
  unsigned_long *local_70;
  difference_type local_68;
  difference_type *local_60;
  difference_type *distance;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *local_50;
  unsigned_long *local_48;
  unsigned_long **local_40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *insert_iter;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  **local_28;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *adjacency;
  size_t insert_vertex_local;
  size_t vertex_local;
  Adjacency_Graph<false> *this_local;
  
  adjacency = (pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)insert_vertex;
  insert_vertex_local = vertex;
  vertex_local = (size_t)this;
  _insert_iter = vertex_adjacency_iter(this,&insert_vertex_local);
  local_28 = &insert_iter;
  local_50 = insert_iter;
  distance = (difference_type *)local_30._M_current;
  local_48 = (unsigned_long *)
             std::
             lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                       ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )insert_iter,local_30,(unsigned_long *)&adjacency);
  local_40 = &local_48;
  local_70 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (&this->vertex_adjacent_list);
  local_78 = *local_40;
  local_68 = std::
             distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )local_70,
                        (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )local_78);
  local_60 = &local_68;
  local_90._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 (&this->vertex_adjacent_list);
  local_88 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator+(&local_90,*local_60);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_80,&local_88);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
            (&this->vertex_adjacent_list,local_80,(value_type *)&adjacency);
  return;
}

Assistant:

void Adjacency_Graph<_directed>::insert_vertex_adjacent_list(std::size_t vertex, std::size_t insert_vertex) {
  const auto& adjacency = vertex_adjacency_iter(vertex);
  const auto& insert_iter = std::lower_bound(adjacency.first, adjacency.second, insert_vertex);
  const auto& distance = std::distance(vertex_adjacent_list.begin(), insert_iter);
  vertex_adjacent_list.insert(vertex_adjacent_list.begin() + distance, insert_vertex);
}